

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.c
# Opt level: O1

exr_result_t
internal_decode_free_buffer
          (exr_decode_pipeline_t *decode,exr_transcoding_pipeline_buffer_id_t bufid,void **buf,
          size_t *sz)

{
  void *pvVar1;
  exr_const_context_t p_Var2;
  bool bVar3;
  exr_result_t eVar4;
  
  pvVar1 = *buf;
  if (pvVar1 != (void *)0x0) {
    if (*sz != 0) {
      if (decode->free_fn == (_func_void_exr_transcoding_pipeline_buffer_id_t_void_ptr *)0x0) {
        p_Var2 = decode->context;
        if (p_Var2 == (exr_const_context_t)0x0) {
          eVar4 = 2;
          bVar3 = false;
        }
        else if ((decode->part_index < 0) || (*(int *)(p_Var2 + 0xc4) <= decode->part_index)) {
          bVar3 = false;
          eVar4 = (**(code **)(p_Var2 + 0x48))(p_Var2,4,"Part index (%d) out of range");
        }
        else {
          eVar4 = (**(code **)(p_Var2 + 0x60))(pvVar1);
          bVar3 = true;
        }
        if (!bVar3) {
          return eVar4;
        }
      }
      else {
        (*decode->free_fn)(bufid,pvVar1);
      }
    }
    *buf = (void *)0x0;
  }
  *sz = 0;
  return 0;
}

Assistant:

exr_result_t
internal_decode_free_buffer (
    exr_decode_pipeline_t*               decode,
    exr_transcoding_pipeline_buffer_id_t bufid,
    void**                               buf,
    size_t*                              sz)
{
    void*  curbuf = *buf;
    size_t cursz  = *sz;
    if (curbuf)
    {
        if (cursz > 0)
        {
            if (decode->free_fn)
                decode->free_fn (bufid, curbuf);
            else
            {
                EXR_PROMOTE_CONST_CONTEXT_AND_PART_OR_ERROR_NO_LOCK (
                    decode->context, decode->part_index);

                pctxt->free_fn (curbuf);
            }
        }
        *buf = NULL;
    }
    *sz = 0;
    return EXR_ERR_SUCCESS;
}